

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmRtm<(moira::Instr)158,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Av<(moira::Instr)158,_(moira::Mode)12,_4> local_38;
  int local_34;
  int local_30;
  Rn local_28;
  u16 local_22;
  Rn src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22 = op;
  _src = addr;
  Rn::Rn(&local_28,op & 0xf);
  pSVar1 = StrWriter::operator<<(str);
  local_30 = (str->tab).raw;
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_30);
  local_34 = local_28.raw;
  StrWriter::operator<<(pSVar1,local_28);
  local_38.ext1 = 0;
  StrWriter::operator<<(str,&local_38);
  return;
}

Assistant:

void
Moira::dasmRtm(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Rn ( ____________xxxx(op) );

    str << Ins<I>{} << str.tab << src;
    str << Av<I, M, S>{};
}